

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SemanticAnalyserTests.cpp
# Opt level: O0

void __thiscall
SemanticAnalyserTest_AssignmentWorks_Test::~SemanticAnalyserTest_AssignmentWorks_Test
          (SemanticAnalyserTest_AssignmentWorks_Test *this)

{
  void *in_RDI;
  
  ~SemanticAnalyserTest_AssignmentWorks_Test((SemanticAnalyserTest_AssignmentWorks_Test *)0x1e8d18);
  operator_delete(in_RDI,0x10);
  return;
}

Assistant:

TEST(SemanticAnalyserTest, AssignmentWorks)
{
  std::string source = R"SRC(
  fn main(): f32
  {
    let x: f32 = 2;
    x = 1;
    x += 2;
  }
  )SRC";
  throwTest(source);
}